

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O1

void sample_output<trng::yarn3s>(yarn3s *r,string *name)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  ostream *poVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  uVar7 = name->_M_string_length;
  uStack_38 = in_RAX;
  while (uVar7 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar7 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar7);
  iVar6 = 0xf;
  do {
    iVar4 = (r->S).r[0];
    iVar1 = (r->S).r[1];
    uVar7 = (long)(r->S).r[2] * (long)(r->P).a[2] +
            (long)(r->P).a[1] * (long)iVar1 + (long)(r->P).a[0] * (long)iVar4;
    (r->S).r[2] = iVar1;
    (r->S).r[1] = iVar4;
    uVar7 = (uVar7 >> 0x1f) * -0x7fffadb3 + uVar7;
    uVar7 = (uVar7 >> 0x1f) * -0x7fffadb3 + uVar7;
    uVar2 = (uint)uVar7;
    uVar3 = uVar2 + 0x8000524d;
    if (uVar7 < 0x7fffadb3) {
      uVar3 = uVar2;
    }
    (r->S).r[0] = uVar3;
    if (uVar3 == 0) {
      iVar4 = 0;
    }
    else {
      uVar7 = ((ulong)*(uint *)(trng::yarn3s::g + (ulong)(uVar3 & 0xffff) * 4) *
               (ulong)*(uint *)(trng::yarn3s::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000) >> 0x1f)
              * -0x7fffadb3 +
              (ulong)*(uint *)(trng::yarn3s::g + (ulong)(uVar3 & 0xffff) * 4) *
              (ulong)*(uint *)(trng::yarn3s::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000);
      uVar7 = (uVar7 >> 0x1f) * -0x7fffadb3 + uVar7;
      iVar1 = (int)uVar7;
      iVar4 = iVar1 + -0x7fffadb3;
      if (uVar7 < 0x7fffadb3) {
        iVar4 = iVar1;
      }
    }
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    uStack_38._0_7_ = CONCAT16(9,(undefined6)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)((long)&uStack_38 + 6),1);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = (r->S).r[0];
  iVar4 = (r->S).r[1];
  uVar7 = (long)(r->S).r[2] * (long)(r->P).a[2] +
          (long)(r->P).a[1] * (long)iVar4 + (long)(r->P).a[0] * (long)iVar6;
  (r->S).r[2] = iVar4;
  (r->S).r[1] = iVar6;
  uVar7 = (uVar7 >> 0x1f) * -0x7fffadb3 + uVar7;
  uVar7 = (uVar7 >> 0x1f) * -0x7fffadb3 + uVar7;
  uVar2 = (uint)uVar7;
  uVar3 = uVar2 + 0x8000524d;
  if (uVar7 < 0x7fffadb3) {
    uVar3 = uVar2;
  }
  (r->S).r[0] = uVar3;
  if (uVar3 == 0) {
    iVar6 = 0;
  }
  else {
    uVar7 = ((ulong)*(uint *)(trng::yarn3s::g + (ulong)(uVar3 & 0xffff) * 4) *
             (ulong)*(uint *)(trng::yarn3s::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000) >> 0x1f) *
            -0x7fffadb3 +
            (ulong)*(uint *)(trng::yarn3s::g + (ulong)(uVar3 & 0xffff) * 4) *
            (ulong)*(uint *)(trng::yarn3s::g + (long)((int)uVar3 >> 0x10) * 4 + 0x40000);
    uVar7 = (uVar7 >> 0x1f) * -0x7fffadb3 + uVar7;
    iVar4 = (int)uVar7;
    iVar6 = iVar4 + -0x7fffadb3;
    if (uVar7 < 0x7fffadb3) {
      iVar6 = iVar4;
    }
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}